

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManFilter_rec(If_DsdMan_t *pNew,If_DsdMan_t *p,int i,Vec_Int_t *vMap)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  Vec_Mem_t *pVVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  word *pTruth;
  ulong uVar9;
  int pFanins [12];
  int local_68 [14];
  
  if ((i < 0) || (vMap->nSize <= i)) {
LAB_00423313:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (-1 < vMap->pArray[(uint)i]) {
    return;
  }
  if (i < (p->vObjs).nSize) {
    piVar3 = (int *)(p->vObjs).pArray[(uint)i];
    uVar6 = piVar3[1];
    uVar7 = (ulong)(uVar6 >> 0x1b);
    if ((0x7ffffff < uVar6) && (uVar8 = piVar3[2], uVar8 != 0)) {
      uVar9 = 1;
      do {
        if ((int)uVar8 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        If_DsdManFilter_rec(pNew,p,uVar8 >> 1,vMap);
        uVar6 = piVar3[1];
        uVar7 = (ulong)(uVar6 >> 0x1b);
        if (uVar7 <= uVar9) break;
        uVar8 = piVar3[uVar9 + 2];
        uVar9 = uVar9 + 1;
      } while (uVar8 != 0);
    }
    if ((int)uVar7 != 0) {
      uVar9 = 0;
      do {
        uVar8 = piVar3[uVar9 + 2];
        if (uVar8 == 0) break;
        if ((int)uVar8 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x134,"int Abc_Lit2LitV(int *, int)");
        }
        if (vMap->pArray[uVar8 >> 1] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_68[uVar9] = (uVar8 & 1) + vMap->pArray[uVar8 >> 1] * 2;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    if ((uVar6 & 7) == 6) {
      pVVar4 = p->vTtMem[uVar7];
      uVar8 = 0xffffffff;
      if (0x17ffffff < uVar6) {
        iVar2 = *piVar3;
        if (((long)iVar2 < 0) || ((p->vTruths).nSize <= iVar2)) goto LAB_00423313;
        uVar8 = (p->vTruths).pArray[iVar2];
      }
      if (((int)uVar8 < 0) || (pVVar4->nEntries <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pTruth = pVVar4->ppPages[uVar8 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
               (long)(int)(uVar8 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
    }
    else {
      pTruth = (word *)0x0;
    }
    uVar6 = If_DsdObjFindOrAdd(pNew,uVar6 & 7,local_68,(int)uVar7,pTruth);
    if ((*(byte *)((long)piVar3 + 5) & 1) != 0) {
      if (((int)uVar6 < 0) || ((pNew->vObjs).nSize <= (int)uVar6)) goto LAB_00423351;
      puVar1 = (uint *)((long)(pNew->vObjs).pArray[uVar6] + 4);
      *puVar1 = *puVar1 | 0x100;
    }
    if ((-1 < (int)uVar6) && ((int)uVar6 < (pNew->vObjs).nSize)) {
      pvVar5 = (pNew->vObjs).pArray[uVar6];
      *(uint *)((long)pvVar5 + 4) =
           *(uint *)((long)pvVar5 + 4) & 0xf80001ff | piVar3[1] & 0x7fffe00U;
      if (i < vMap->nSize) {
        vMap->pArray[(uint)i] = uVar6;
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_00423351:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void If_DsdManFilter_rec( If_DsdMan_t * pNew, If_DsdMan_t * p, int i, Vec_Int_t * vMap )
{
    If_DsdObj_t * pObj;
    int pFanins[DAU_MAX_VAR];
    int k, iFanin, Id;
    if ( Vec_IntEntry(vMap, i) >= 0 )
        return;
    // call recursively
    pObj = If_DsdVecObj( &p->vObjs, i );
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, k )
        If_DsdManFilter_rec( pNew, p, Abc_Lit2Var(iFanin), vMap );
    // duplicate this one
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, k )
        pFanins[k] = Abc_Lit2LitV( Vec_IntArray(vMap), iFanin );
    Id = If_DsdObjFindOrAdd( pNew, pObj->Type, pFanins, pObj->nFans, pObj->Type == IF_DSD_PRIME ? If_DsdObjTruth(p, pObj) : NULL );
    if ( pObj->fMark )
        If_DsdVecObjSetMark( &pNew->vObjs, Id );
    If_DsdVecObj( &pNew->vObjs, Id )->Count = pObj->Count;
    // save the result
    Vec_IntWriteEntry( vMap, i, Id );
}